

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O0

void ZopfliLZ77Optimal(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,int numiterations,
                      ZopfliLZ77Store *store)

{
  unsigned_short **path_00;
  long in_RCX;
  long in_RDX;
  uchar *in_RSI;
  long *in_RDI;
  int in_R8D;
  ZopfliBlockState *pZVar1;
  int lastrandomstep;
  RanState ran_state;
  double lastcost;
  double bestcost;
  double cost;
  float *costs;
  int i;
  SymbolStats laststats;
  SymbolStats beststats;
  SymbolStats stats;
  ZopfliHash *h;
  ZopfliHash hash;
  ZopfliLZ77Store currentstore;
  size_t pathsize;
  unsigned_short *path;
  unsigned_short *length_array;
  size_t blocksize;
  ZopfliHash *in_stack_ffffffffffffc298;
  SymbolStats *dest;
  size_t in_stack_ffffffffffffc2a0;
  code *source;
  SymbolStats *in_stack_ffffffffffffc2a8;
  SymbolStats *stats_00;
  ZopfliLZ77Store *in_stack_ffffffffffffc2b0;
  ZopfliLZ77Store *source_00;
  undefined4 in_stack_ffffffffffffc2c8;
  uint uVar2;
  RanState in_stack_ffffffffffffc2d0;
  ZopfliBlockState *in_00;
  ZopfliBlockState *s_00;
  undefined4 in_stack_ffffffffffffc2f8;
  uint uVar3;
  void *in_stack_ffffffffffffc300;
  ZopfliLZ77Store *in_stack_ffffffffffffc308;
  ZopfliHash *in_stack_ffffffffffffc310;
  float *in_stack_ffffffffffffc318;
  ZopfliHash *in_stack_ffffffffffffc4e8;
  ZopfliLZ77Store *in_stack_ffffffffffffc4f0;
  size_t in_stack_ffffffffffffc4f8;
  size_t in_stack_ffffffffffffc500;
  uchar *in_stack_ffffffffffffc508;
  ZopfliBlockState *in_stack_ffffffffffffc510;
  int in_stack_ffffffffffffc7d4;
  size_t in_stack_ffffffffffffc7d8;
  size_t in_stack_ffffffffffffc7e0;
  ZopfliLZ77Store *in_stack_ffffffffffffc7e8;
  SymbolStats local_1500;
  size_t *local_100;
  size_t local_f8 [9];
  ZopfliLZ77Store local_b0;
  undefined8 local_68;
  void *local_60;
  SymbolStats *local_58;
  long local_50;
  int local_3c;
  uchar *local_28;
  long *local_20;
  
  local_50 = in_RCX - in_RDX;
  local_3c = in_R8D;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_58 = (SymbolStats *)malloc((local_50 + 1) * 2);
  local_60 = (void *)0x0;
  local_68 = 0;
  local_100 = local_f8;
  path_00 = (unsigned_short **)malloc((local_50 + 1) * 4);
  s_00 = (ZopfliBlockState *)0x46293e5939a08cea;
  in_00 = (ZopfliBlockState *)0x0;
  uVar2 = 0xffffffff;
  if (path_00 == (unsigned_short **)0x0) {
    exit(-1);
  }
  if (local_58 == (SymbolStats *)0x0) {
    exit(-1);
  }
  InitRanState((RanState *)&stack0xffffffffffffc2d0);
  InitStats((SymbolStats *)0x109e6f);
  ZopfliInitLZ77Store(local_28,&local_b0);
  ZopfliAllocHash(in_stack_ffffffffffffc2a0,in_stack_ffffffffffffc298);
  ZopfliLZ77Greedy(in_stack_ffffffffffffc510,in_stack_ffffffffffffc508,in_stack_ffffffffffffc500,
                   in_stack_ffffffffffffc4f8,in_stack_ffffffffffffc4f0,in_stack_ffffffffffffc4e8);
  GetStatistics(in_stack_ffffffffffffc2b0,in_stack_ffffffffffffc2a8);
  for (uVar3 = 0; (int)uVar3 < local_3c; uVar3 = uVar3 + 1) {
    ZopfliCleanLZ77Store((ZopfliLZ77Store *)0x109f06);
    ZopfliInitLZ77Store(local_28,&local_b0);
    stats_00 = &local_1500;
    source_00 = &local_b0;
    source = GetCostStat;
    dest = local_58;
    LZ77OptimalRun(s_00,(uchar *)in_00,(size_t)in_stack_ffffffffffffc2d0,
                   CONCAT44(uVar2,in_stack_ffffffffffffc2c8),path_00,local_100,
                   (unsigned_short *)path_00,
                   (CostModelFun *)CONCAT44(uVar3,in_stack_ffffffffffffc2f8),
                   in_stack_ffffffffffffc300,in_stack_ffffffffffffc308,in_stack_ffffffffffffc310,
                   in_stack_ffffffffffffc318);
    pZVar1 = (ZopfliBlockState *)
             ZopfliCalculateBlockSize
                       (in_stack_ffffffffffffc7e8,in_stack_ffffffffffffc7e0,
                        in_stack_ffffffffffffc7d8,in_stack_ffffffffffffc7d4);
    if ((*(int *)(*local_20 + 4) != 0) ||
       ((*(int *)*local_20 != 0 && ((double)pZVar1 < (double)s_00)))) {
      fprintf(_stderr,"Iteration %d: %d bit\n",(ulong)uVar3,(ulong)(uint)(int)(double)pZVar1);
    }
    if ((double)pZVar1 < (double)s_00) {
      ZopfliCopyLZ77Store(source_00,(ZopfliLZ77Store *)stats_00);
      CopyStats((SymbolStats *)source,dest);
      s_00 = pZVar1;
    }
    CopyStats((SymbolStats *)source,dest);
    ClearStatFreqs(&local_1500);
    GetStatistics(source_00,stats_00);
    if (uVar2 != 0xffffffff) {
      AddWeighedStatFreqs(&local_1500,1.0,(SymbolStats *)&stack0xffffffffffffc300,0.5,&local_1500);
      CalculateStatistics((SymbolStats *)0x10a0c7);
    }
    if (((5 < (int)uVar3) && ((double)pZVar1 == (double)in_00)) &&
       (!NAN((double)pZVar1) && !NAN((double)in_00))) {
      CopyStats((SymbolStats *)source,dest);
      RandomizeStatFreqs((RanState *)source,dest);
      uVar2 = uVar3;
      CalculateStatistics((SymbolStats *)0x10a112);
      uVar3 = uVar2;
    }
    in_00 = pZVar1;
  }
  free(local_58);
  free(local_60);
  free(path_00);
  ZopfliCleanLZ77Store((ZopfliLZ77Store *)0x10a167);
  ZopfliCleanHash((ZopfliHash *)0x10a174);
  return;
}

Assistant:

void ZopfliLZ77Optimal(ZopfliBlockState *s,
                       const unsigned char* in, size_t instart, size_t inend,
                       int numiterations,
                       ZopfliLZ77Store* store) {
  /* Dist to get to here with smallest cost. */
  size_t blocksize = inend - instart;
  unsigned short* length_array =
      (unsigned short*)malloc(sizeof(unsigned short) * (blocksize + 1));
  unsigned short* path = 0;
  size_t pathsize = 0;
  ZopfliLZ77Store currentstore;
  ZopfliHash hash;
  ZopfliHash* h = &hash;
  SymbolStats stats, beststats, laststats;
  int i;
  float* costs = (float*)malloc(sizeof(float) * (blocksize + 1));
  double cost;
  double bestcost = ZOPFLI_LARGE_FLOAT;
  double lastcost = 0;
  /* Try randomizing the costs a bit once the size stabilizes. */
  RanState ran_state;
  int lastrandomstep = -1;

  if (!costs) exit(-1); /* Allocation failed. */
  if (!length_array) exit(-1); /* Allocation failed. */

  InitRanState(&ran_state);
  InitStats(&stats);
  ZopfliInitLZ77Store(in, &currentstore);
  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  /* Do regular deflate, then loop multiple shortest path runs, each time using
  the statistics of the previous run. */

  /* Initial run. */
  ZopfliLZ77Greedy(s, in, instart, inend, &currentstore, h);
  GetStatistics(&currentstore, &stats);

  /* Repeat statistics with each time the cost model from the previous stat
  run. */
  for (i = 0; i < numiterations; i++) {
    ZopfliCleanLZ77Store(&currentstore);
    ZopfliInitLZ77Store(in, &currentstore);
    LZ77OptimalRun(s, in, instart, inend, &path, &pathsize,
                   length_array, GetCostStat, (void*)&stats,
                   &currentstore, h, costs);
    cost = ZopfliCalculateBlockSize(&currentstore, 0, currentstore.size, 2);
    if (s->options->verbose_more || (s->options->verbose && cost < bestcost)) {
      fprintf(stderr, "Iteration %d: %d bit\n", i, (int) cost);
    }
    if (cost < bestcost) {
      /* Copy to the output store. */
      ZopfliCopyLZ77Store(&currentstore, store);
      CopyStats(&stats, &beststats);
      bestcost = cost;
    }
    CopyStats(&stats, &laststats);
    ClearStatFreqs(&stats);
    GetStatistics(&currentstore, &stats);
    if (lastrandomstep != -1) {
      /* This makes it converge slower but better. Do it only once the
      randomness kicks in so that if the user does few iterations, it gives a
      better result sooner. */
      AddWeighedStatFreqs(&stats, 1.0, &laststats, 0.5, &stats);
      CalculateStatistics(&stats);
    }
    if (i > 5 && cost == lastcost) {
      CopyStats(&beststats, &stats);
      RandomizeStatFreqs(&ran_state, &stats);
      CalculateStatistics(&stats);
      lastrandomstep = i;
    }
    lastcost = cost;
  }

  free(length_array);
  free(path);
  free(costs);
  ZopfliCleanLZ77Store(&currentstore);
  ZopfliCleanHash(h);
}